

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_session.c
# Opt level: O2

void dlep_session_remove(dlep_session *session)

{
  oonf_log_source oVar1;
  char *pcVar2;
  list_entity *plVar3;
  undefined8 uVar4;
  list_entity *plVar5;
  netaddr_str nbuf;
  
  oVar1 = session->log_source;
  if (((&log_global_mask)[oVar1] & 1) != 0) {
    pcVar2 = (session->l2_listener).name;
    uVar4 = netaddr_socket_to_string(&nbuf,&session->remote_socket);
    oonf_log(1,(ulong)oVar1,"src/generic/dlep/dlep_session.c",0xbe,0,0,"Remove session if %s to %s",
             pcVar2,uVar4);
  }
  os_interface_linux_remove(&session->l2_listener);
  plVar5 = (session->parser).allowed_tlvs.list_head.next;
  while (plVar5->prev != (session->parser).allowed_tlvs.list_head.prev) {
    plVar3 = plVar5 + -2;
    plVar5 = plVar5->next;
    avl_remove(&session->parser);
    oonf_class_free(&_tlv_class,&plVar3->prev);
  }
  oonf_timer_stop(&session->local_event_timer);
  oonf_timer_stop(&session->remote_heartbeat_timeout);
  (session->parser).extension_count = 0;
  free((session->parser).values);
  (session->parser).values = (dlep_parser_value *)0x0;
  session->_peer_state = DLEP_PEER_NOT_CONNECTED;
  return;
}

Assistant:

void
dlep_session_remove(struct dlep_session *session) {
  struct dlep_parser_tlv *tlv, *tlv_it;
  struct dlep_session_parser *parser;
#ifdef OONF_LOG_DEBUG_INFO
  struct netaddr_str nbuf;
#endif

  OONF_DEBUG(session->log_source, "Remove session if %s to %s", session->l2_listener.name,
    netaddr_socket_to_string(&nbuf, &session->remote_socket));

  os_interface_remove(&session->l2_listener);

  parser = &session->parser;
  avl_for_each_element_safe(&parser->allowed_tlvs, tlv, _node, tlv_it) {
    avl_remove(&parser->allowed_tlvs, &tlv->_node);
    oonf_class_free(&_tlv_class, tlv);
  }

  oonf_timer_stop(&session->local_event_timer);
  oonf_timer_stop(&session->remote_heartbeat_timeout);

  parser->extension_count = 0;

  free(parser->values);
  parser->values = NULL;

  session->_peer_state = DLEP_PEER_NOT_CONNECTED;
}